

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O3

vector<bool,_std::allocator<bool>_> * __thiscall
OpenMD::SelectionSet::get
          (vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,SelectionSet *this,
          vector<int,_std::allocator<int>_> *bitIndex)

{
  int iVar1;
  pointer piVar2;
  ulong *puVar3;
  ulong in_RAX;
  pointer pOVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX & 0xffffffffffffff;
  std::vector<bool,_std::allocator<bool>_>::vector
            (__return_storage_ptr__,6,(bool *)((long)&uStack_28 + 7),
             (allocator_type *)((long)&uStack_28 + 6));
  pOVar4 = (this->bitsets_).
           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (bitIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  puVar3 = (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  uVar5 = *puVar3;
  uVar6 = 0;
  do {
    iVar1 = piVar2[uVar6];
    uVar7 = (ulong)iVar1;
    iVar8 = iVar1 + 0x3f;
    if (-1 < (long)uVar7) {
      iVar8 = iVar1;
    }
    uVar9 = uVar5 & ~(1L << (uVar6 & 0x3f));
    uVar5 = uVar5 | 1L << (uVar6 & 0x3f);
    if ((*(ulong *)((long)(iVar8 >> 6) * 8 +
                    *(long *)&(pOVar4->bitset_).super__Bvector_base<std::allocator<bool>_> + -8 +
                   (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) * 8) >> (uVar7 & 0x3f)
        & 1) == 0) {
      uVar5 = uVar9;
    }
    *puVar3 = uVar5;
    uVar6 = uVar6 + 1;
    pOVar4 = pOVar4 + 1;
  } while (uVar6 != 6);
  return __return_storage_ptr__;
}

Assistant:

std::vector<bool> SelectionSet::get(std::vector<int> bitIndex) {
    std::vector<bool> result(N_SELECTIONTYPES);
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      result[i] = bitsets_[i].get(bitIndex[i]);
    return result;
  }